

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O1

Hop_Obj_t *
Abc_NodeIfToHop_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  long lVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  void **ppvVar5;
  int iVar6;
  
  if (*(Hop_Obj_t **)&pIfObj->CutBest != (Hop_Obj_t *)0x0) {
    return *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  pHVar3 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin0,vVisited);
  pHVar4 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin1,vVisited);
  pHVar3 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 4 & 1) ^ (ulong)pHVar3),
                   (Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 5 & 1) ^ (ulong)pHVar4));
  lVar2._0_4_ = (pIfObj->CutBest).Area;
  lVar2._4_4_ = (pIfObj->CutBest).Edge;
  if (lVar2 != 0) {
    __assert_fail("If_CutData(pCut) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x23c,
                  "Hop_Obj_t *Abc_NodeIfToHop_rec(Hop_Man_t *, If_Man_t *, If_Obj_t *, Vec_Ptr_t *)"
                 );
  }
  *(Hop_Obj_t **)&pIfObj->CutBest = pHVar3;
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_002d2fdd;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar5;
    }
    vVisited->nCap = iVar6;
  }
LAB_002d2fdd:
  iVar6 = vVisited->nSize;
  vVisited->nSize = iVar6 + 1;
  vVisited->pArray[iVar6] = &pIfObj->CutBest;
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    gFunc0 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin0, vVisited );
    gFunc1 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin1, vVisited );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, pIfObj->fCompl0), Hop_NotCond(gFunc1, pIfObj->fCompl1) );  
    assert( If_CutData(pCut) == NULL );
    If_CutSetData( pCut, gFunc );
    // add this cut to the visited list
    Vec_PtrPush( vVisited, pCut );
    return gFunc;
}